

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit-prim-types.cc
# Opt level: O2

void prim_type_test(void)

{
  bool bVar1;
  string *psVar2;
  Path *pPVar3;
  ostream *poVar4;
  int cond;
  allocator local_6ca;
  allocator local_6c9;
  Path cpath;
  Path path_1;
  string local_528;
  Path c;
  Path epath;
  string local_368;
  Path path;
  Path local_278;
  Path fpath;
  Path gpath;
  
  std::__cxx11::string::string((string *)&path_1,"/",(allocator *)&c);
  std::__cxx11::string::string((string *)&cpath,"",(allocator *)&epath);
  tinyusdz::Path::Path(&path,&path_1._prim_part,&cpath._prim_part);
  std::__cxx11::string::~string((string *)&cpath);
  std::__cxx11::string::~string((string *)&path_1);
  cond = 0;
  if (((path._valid == true) && (path._prim_part._M_string_length == 1)) &&
     (*path._prim_part._M_dataplus._M_p == '/')) {
    cond = 1;
  }
  acutest_check_(cond,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/tests/unit/unit-prim-types.cc"
                 ,0x11,"%s","path.is_root_path() == true");
  bVar1 = tinyusdz::Path::is_root_prim(&path);
  acutest_check_((uint)!bVar1,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/tests/unit/unit-prim-types.cc"
                 ,0x12,"%s","path.is_root_prim() == false");
  tinyusdz::Path::get_parent_path(&path_1,&path);
  acutest_check_(path_1._valid ^ 1,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/tests/unit/unit-prim-types.cc"
                 ,0x14,"%s","path.get_parent_path().is_valid() == false");
  tinyusdz::Path::~Path(&path_1);
  tinyusdz::Path::~Path(&path);
  std::__cxx11::string::string((string *)&path,"/bora",(allocator *)&c);
  std::__cxx11::string::string((string *)&cpath,"",(allocator *)&epath);
  tinyusdz::Path::Path(&path_1,&path._prim_part,&cpath._prim_part);
  std::__cxx11::string::~string((string *)&cpath);
  std::__cxx11::string::~string((string *)&path);
  tinyusdz::Path::split_at_root((pair<tinyusdz::Path,_tinyusdz::Path> *)&path,&path_1);
  tinyusdz::Path::full_path_name_abi_cxx11_(&cpath._prim_part,&path);
  bVar1 = std::operator==(&cpath._prim_part,"/bora");
  acutest_check_((uint)bVar1,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/tests/unit/unit-prim-types.cc"
                 ,0x1a,"%s","std::get<0>(ret).full_path_name() == \"/bora\"");
  std::__cxx11::string::~string((string *)&cpath);
  acutest_check_((uint)((local_278._variant_part._M_string_length == 0 &&
                        local_278._prim_part._M_string_length == 0) &&
                       local_278._prop_part._M_string_length == 0),
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/tests/unit/unit-prim-types.cc"
                 ,0x1b,"%s","std::get<1>(ret).is_empty() == true");
  tinyusdz::Path::get_parent_path(&cpath,&path_1);
  tinyusdz::Path::full_path_name_abi_cxx11_(&c._prim_part,&cpath);
  bVar1 = std::operator==(&c._prim_part,"/");
  acutest_check_((uint)bVar1,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/tests/unit/unit-prim-types.cc"
                 ,0x1c,"%s","path.get_parent_path().full_path_name() == \"/\"");
  std::__cxx11::string::~string((string *)&c);
  tinyusdz::Path::~Path(&cpath);
  tinyusdz::Path::get_parent_prim_path(&cpath,&path_1);
  tinyusdz::Path::full_path_name_abi_cxx11_(&c._prim_part,&cpath);
  bVar1 = std::operator==(&c._prim_part,"/bora");
  acutest_check_((uint)bVar1,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/tests/unit/unit-prim-types.cc"
                 ,0x1d,"%s","path.get_parent_prim_path().full_path_name() == \"/bora\"");
  std::__cxx11::string::~string((string *)&c);
  tinyusdz::Path::~Path(&cpath);
  std::pair<tinyusdz::Path,_tinyusdz::Path>::~pair((pair<tinyusdz::Path,_tinyusdz::Path> *)&path);
  tinyusdz::Path::~Path(&path_1);
  std::__cxx11::string::string((string *)&path,"/dora/bora",(allocator *)&c);
  std::__cxx11::string::string((string *)&cpath,"",(allocator *)&epath);
  tinyusdz::Path::Path(&path_1,&path._prim_part,&cpath._prim_part);
  std::__cxx11::string::~string((string *)&cpath);
  std::__cxx11::string::~string((string *)&path);
  psVar2 = tinyusdz::Path::element_name_abi_cxx11_(&path_1);
  bVar1 = std::operator==(psVar2,"bora");
  acutest_check_((uint)bVar1,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/tests/unit/unit-prim-types.cc"
                 ,0x22,"%s","path.element_name() == \"bora\"");
  tinyusdz::Path::split_at_root((pair<tinyusdz::Path,_tinyusdz::Path> *)&path,&path_1);
  acutest_check_((uint)path._valid,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/tests/unit/unit-prim-types.cc"
                 ,0x24,"%s","std::get<0>(ret).is_valid() == true");
  tinyusdz::Path::full_path_name_abi_cxx11_(&cpath._prim_part,&path);
  bVar1 = std::operator==(&cpath._prim_part,"/dora");
  acutest_check_((uint)bVar1,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/tests/unit/unit-prim-types.cc"
                 ,0x25,"%s","std::get<0>(ret).full_path_name() == \"/dora\"");
  std::__cxx11::string::~string((string *)&cpath);
  acutest_check_((uint)local_278._valid,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/tests/unit/unit-prim-types.cc"
                 ,0x26,"%s","std::get<1>(ret).is_valid() == true");
  tinyusdz::Path::full_path_name_abi_cxx11_(&cpath._prim_part,&local_278);
  bVar1 = std::operator==(&cpath._prim_part,"/bora");
  acutest_check_((uint)bVar1,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/tests/unit/unit-prim-types.cc"
                 ,0x27,"%s","std::get<1>(ret).full_path_name() == \"/bora\"");
  std::__cxx11::string::~string((string *)&cpath);
  std::pair<tinyusdz::Path,_tinyusdz::Path>::~pair((pair<tinyusdz::Path,_tinyusdz::Path> *)&path);
  tinyusdz::Path::~Path(&path_1);
  std::__cxx11::string::string((string *)&path,"dora",(allocator *)&c);
  std::__cxx11::string::string((string *)&cpath,"",(allocator *)&epath);
  tinyusdz::Path::Path(&path_1,&path._prim_part,&cpath._prim_part);
  std::__cxx11::string::~string((string *)&cpath);
  std::__cxx11::string::~string((string *)&path);
  tinyusdz::Path::split_at_root((pair<tinyusdz::Path,_tinyusdz::Path> *)&path,&path_1);
  acutest_check_((uint)((path._variant_part._M_string_length == 0 &&
                        path._prim_part._M_string_length == 0) &&
                       path._prop_part._M_string_length == 0),
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/tests/unit/unit-prim-types.cc"
                 ,0x2d,"%s","std::get<0>(ret).is_empty() == true");
  acutest_check_((uint)local_278._valid,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/tests/unit/unit-prim-types.cc"
                 ,0x2e,"%s","std::get<1>(ret).is_valid() == true");
  tinyusdz::Path::full_path_name_abi_cxx11_(&cpath._prim_part,&local_278);
  bVar1 = std::operator==(&cpath._prim_part,"dora");
  acutest_check_((uint)bVar1,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/tests/unit/unit-prim-types.cc"
                 ,0x2f,"%s","std::get<1>(ret).full_path_name() == \"dora\"");
  std::__cxx11::string::~string((string *)&cpath);
  tinyusdz::Path::get_parent_path(&cpath,&path_1);
  acutest_check_(cpath._valid ^ 1,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/tests/unit/unit-prim-types.cc"
                 ,0x30,"%s","path.get_parent_path().is_valid() == false");
  tinyusdz::Path::~Path(&cpath);
  std::pair<tinyusdz::Path,_tinyusdz::Path>::~pair((pair<tinyusdz::Path,_tinyusdz::Path> *)&path);
  tinyusdz::Path::~Path(&path_1);
  std::__cxx11::string::string((string *)&path_1,"dora",(allocator *)&c);
  std::__cxx11::string::string((string *)&cpath,"",(allocator *)&epath);
  tinyusdz::Path::Path(&path,&path_1._prim_part,&cpath._prim_part);
  std::__cxx11::string::~string((string *)&cpath);
  std::__cxx11::string::~string((string *)&path_1);
  pPVar3 = tinyusdz::Path::make_relative(&path);
  tinyusdz::Path::full_path_name_abi_cxx11_(&path_1._prim_part,pPVar3);
  bVar1 = std::operator==(&path_1._prim_part,"dora");
  acutest_check_((uint)bVar1,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/tests/unit/unit-prim-types.cc"
                 ,0x35,"%s","rpath.make_relative().full_path_name() == \"dora\"");
  std::__cxx11::string::~string((string *)&path_1);
  std::__cxx11::string::string((string *)&cpath,"/dora",(allocator *)&epath);
  std::__cxx11::string::string((string *)&c,"",(allocator *)&fpath);
  tinyusdz::Path::Path(&path_1,&cpath._prim_part,&c._prim_part);
  std::__cxx11::string::~string((string *)&c);
  std::__cxx11::string::~string((string *)&cpath);
  pPVar3 = tinyusdz::Path::make_relative(&path_1);
  tinyusdz::Path::full_path_name_abi_cxx11_(&cpath._prim_part,pPVar3);
  bVar1 = std::operator==(&cpath._prim_part,"dora");
  acutest_check_((uint)bVar1,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/tests/unit/unit-prim-types.cc"
                 ,0x38,"%s","apath.make_relative().full_path_name() == \"dora\"");
  std::__cxx11::string::~string((string *)&cpath);
  std::__cxx11::string::string((string *)&c,"/dora",(allocator *)&fpath);
  std::__cxx11::string::string((string *)&epath,"",(allocator *)&gpath);
  tinyusdz::Path::Path(&cpath,&c._prim_part,&epath._prim_part);
  std::__cxx11::string::~string((string *)&epath);
  std::__cxx11::string::~string((string *)&c);
  c._prim_part._M_dataplus._M_p = (pointer)&c._prim_part.field_2;
  c._prim_part._M_string_length = 0;
  c._prim_part.field_2._M_local_buf[0] = '\0';
  c._prop_part._M_dataplus._M_p = (pointer)&c._prop_part.field_2;
  c._prop_part._M_string_length = 0;
  c._prop_part.field_2._M_local_buf[0] = '\0';
  c._variant_part._M_dataplus._M_p = (pointer)&c._variant_part.field_2;
  c._variant_part._M_string_length = 0;
  c._variant_part.field_2._M_local_buf[0] = '\0';
  c._variant_selection_part._M_dataplus._M_p = (pointer)&c._variant_selection_part.field_2;
  c._variant_selection_part._M_string_length = 0;
  c._variant_selection_part.field_2._M_local_buf[0] = '\0';
  c._variant_part_str._M_dataplus._M_p = (pointer)&c._variant_part_str.field_2;
  c._variant_part_str._M_string_length = 0;
  c._variant_part_str.field_2._M_local_buf[0] = '\0';
  c._element._M_dataplus._M_p = (pointer)&c._element.field_2;
  c._element._M_string_length = 0;
  c._element.field_2._M_local_buf[0] = '\0';
  c._path_type.has_value_ = false;
  c._path_type.contained = (storage_t<tinyusdz::Path::PathType>)0x0;
  c._valid = false;
  tinyusdz::Path::make_relative(&epath,&cpath);
  tinyusdz::Path::full_path_name_abi_cxx11_(&fpath._prim_part,&epath);
  bVar1 = std::operator==(&fpath._prim_part,"dora");
  acutest_check_((uint)bVar1,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/tests/unit/unit-prim-types.cc"
                 ,0x3c,"%s","c.make_relative(cpath).full_path_name() == \"dora\"");
  std::__cxx11::string::~string((string *)&fpath);
  tinyusdz::Path::~Path(&epath);
  tinyusdz::Path::~Path(&c);
  tinyusdz::Path::~Path(&cpath);
  tinyusdz::Path::~Path(&path_1);
  tinyusdz::Path::~Path(&path);
  std::__cxx11::string::string((string *)&path_1,"/dora",(allocator *)&c);
  std::__cxx11::string::string((string *)&cpath,"bora",(allocator *)&epath);
  tinyusdz::Path::Path(&path,&path_1._prim_part,&cpath._prim_part);
  std::__cxx11::string::~string((string *)&cpath);
  std::__cxx11::string::~string((string *)&path_1);
  tinyusdz::Path::full_path_name_abi_cxx11_(&path_1._prim_part,&path);
  bVar1 = std::operator==(&path_1._prim_part,"/dora.bora");
  acutest_check_((uint)bVar1,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/tests/unit/unit-prim-types.cc"
                 ,0x41,"%s","rpath.full_path_name() == \"/dora.bora\"");
  std::__cxx11::string::~string((string *)&path_1);
  std::__cxx11::string::string((string *)&cpath,"/dora.bora",(allocator *)&epath);
  std::__cxx11::string::string((string *)&c,"",(allocator *)&fpath);
  tinyusdz::Path::Path(&path_1,&cpath._prim_part,&c._prim_part);
  std::__cxx11::string::~string((string *)&c);
  std::__cxx11::string::~string((string *)&cpath);
  tinyusdz::Path::full_path_name_abi_cxx11_(&cpath._prim_part,&path_1);
  bVar1 = std::operator==(&cpath._prim_part,"/dora.bora");
  acutest_check_((uint)bVar1,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/tests/unit/unit-prim-types.cc"
                 ,0x46,"%s","apath.full_path_name() == \"/dora.bora\"");
  std::__cxx11::string::~string((string *)&cpath);
  psVar2 = tinyusdz::Path::element_name_abi_cxx11_(&path_1);
  bVar1 = std::operator==(psVar2,"bora");
  acutest_check_((uint)bVar1,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/tests/unit/unit-prim-types.cc"
                 ,0x47,"%s","apath.element_name() == \"bora\"");
  tinyusdz::Path::~Path(&path_1);
  tinyusdz::Path::~Path(&path);
  std::__cxx11::string::string((string *)&path_1,"/dora",(allocator *)&c);
  std::__cxx11::string::string((string *)&cpath,"bora",(allocator *)&epath);
  tinyusdz::Path::Path(&path,&path_1._prim_part,&cpath._prim_part);
  std::__cxx11::string::~string((string *)&cpath);
  std::__cxx11::string::~string((string *)&path_1);
  tinyusdz::Path::full_path_name_abi_cxx11_(&path_1._prim_part,&path);
  bVar1 = std::operator==(&path_1._prim_part,"/dora.bora");
  acutest_check_((uint)bVar1,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/tests/unit/unit-prim-types.cc"
                 ,0x4c,"%s","apath.full_path_name() == \"/dora.bora\"");
  std::__cxx11::string::~string((string *)&path_1);
  psVar2 = tinyusdz::Path::element_name_abi_cxx11_(&path);
  bVar1 = std::operator==(psVar2,"bora");
  acutest_check_((uint)bVar1,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/tests/unit/unit-prim-types.cc"
                 ,0x4d,"%s","apath.element_name() == \"bora\"");
  poVar4 = std::operator<<((ostream *)&std::cout,"parent_path = ");
  tinyusdz::Path::get_parent_path(&path_1,&path);
  tinyusdz::Path::full_path_name_abi_cxx11_(&cpath._prim_part,&path_1);
  poVar4 = std::operator<<(poVar4,(string *)&cpath);
  std::operator<<(poVar4,"\n");
  std::__cxx11::string::~string((string *)&cpath);
  tinyusdz::Path::~Path(&path_1);
  poVar4 = std::operator<<((ostream *)&std::cout,"parent_path = ");
  tinyusdz::Path::get_parent_prim_path(&path_1,&path);
  tinyusdz::Path::full_path_name_abi_cxx11_(&cpath._prim_part,&path_1);
  poVar4 = std::operator<<(poVar4,(string *)&cpath);
  std::operator<<(poVar4,"\n");
  std::__cxx11::string::~string((string *)&cpath);
  tinyusdz::Path::~Path(&path_1);
  tinyusdz::Path::get_parent_path(&path_1,&path);
  tinyusdz::Path::full_path_name_abi_cxx11_(&cpath._prim_part,&path_1);
  bVar1 = std::operator==(&cpath._prim_part,"/dora");
  acutest_check_((uint)bVar1,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/tests/unit/unit-prim-types.cc"
                 ,0x51,"%s","apath.get_parent_path().full_path_name() == \"/dora\"");
  std::__cxx11::string::~string((string *)&cpath);
  tinyusdz::Path::~Path(&path_1);
  tinyusdz::Path::~Path(&path);
  std::__cxx11::string::string((string *)&path_1,"/dora/bora",(allocator *)&c);
  std::__cxx11::string::string((string *)&cpath,"",(allocator *)&epath);
  tinyusdz::Path::Path(&path,&path_1._prim_part,&cpath._prim_part);
  std::__cxx11::string::~string((string *)&cpath);
  std::__cxx11::string::~string((string *)&path_1);
  std::__cxx11::string::string((string *)&cpath,"/dora",(allocator *)&epath);
  std::__cxx11::string::string((string *)&c,"",(allocator *)&fpath);
  tinyusdz::Path::Path(&path_1,&cpath._prim_part,&c._prim_part);
  std::__cxx11::string::~string((string *)&c);
  std::__cxx11::string::~string((string *)&cpath);
  std::__cxx11::string::string((string *)&c,"/doraa",(allocator *)&fpath);
  std::__cxx11::string::string((string *)&epath,"",(allocator *)&gpath);
  tinyusdz::Path::Path(&cpath,&c._prim_part,&epath._prim_part);
  std::__cxx11::string::~string((string *)&epath);
  std::__cxx11::string::~string((string *)&c);
  std::__cxx11::string::string((string *)&epath,"hello",(allocator *)&fpath);
  tinyusdz::Path::AppendProperty(&c,&path_1,&epath._prim_part);
  std::__cxx11::string::~string((string *)&epath);
  std::__cxx11::string::string((string *)&fpath,"hell",(allocator *)&gpath);
  tinyusdz::Path::AppendProperty(&epath,&path_1,&fpath._prim_part);
  std::__cxx11::string::~string((string *)&fpath);
  poVar4 = std::operator<<((ostream *)&std::cout,"epath = ");
  tinyusdz::Path::full_path_name_abi_cxx11_(&fpath._prim_part,&epath);
  poVar4 = std::operator<<(poVar4,(string *)&fpath);
  std::operator<<(poVar4,"\n");
  std::__cxx11::string::~string((string *)&fpath);
  bVar1 = tinyusdz::Path::operator<(&path_1,&path);
  acutest_check_((uint)bVar1,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/tests/unit/unit-prim-types.cc"
                 ,0x5d,"%s","bpath < apath");
  bVar1 = tinyusdz::Path::operator<(&path_1,&cpath);
  acutest_check_((uint)bVar1,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/tests/unit/unit-prim-types.cc"
                 ,0x5e,"%s","bpath < cpath");
  bVar1 = tinyusdz::Path::operator<(&path_1,&c);
  acutest_check_((uint)bVar1,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/tests/unit/unit-prim-types.cc"
                 ,0x5f,"%s","bpath < dpath");
  bVar1 = tinyusdz::Path::operator<(&epath,&c);
  acutest_check_((uint)bVar1,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/tests/unit/unit-prim-types.cc"
                 ,0x60,"%s","epath < dpath");
  tinyusdz::Path::~Path(&epath);
  tinyusdz::Path::~Path(&c);
  tinyusdz::Path::~Path(&cpath);
  tinyusdz::Path::~Path(&path_1);
  tinyusdz::Path::~Path(&path);
  std::__cxx11::string::string((string *)&path_1,"/dora/bora",(allocator *)&c);
  std::__cxx11::string::string((string *)&cpath,"",(allocator *)&epath);
  tinyusdz::Path::Path(&path,&path_1._prim_part,&cpath._prim_part);
  std::__cxx11::string::~string((string *)&cpath);
  std::__cxx11::string::~string((string *)&path_1);
  std::__cxx11::string::string((string *)&cpath,"/dora/bora2",(allocator *)&epath);
  std::__cxx11::string::string((string *)&c,"",(allocator *)&fpath);
  tinyusdz::Path::Path(&path_1,&cpath._prim_part,&c._prim_part);
  std::__cxx11::string::~string((string *)&c);
  std::__cxx11::string::~string((string *)&cpath);
  std::__cxx11::string::string((string *)&c,"/doraa",(allocator *)&fpath);
  std::__cxx11::string::string((string *)&epath,"",(allocator *)&gpath);
  tinyusdz::Path::Path(&cpath,&c._prim_part,&epath._prim_part);
  std::__cxx11::string::~string((string *)&epath);
  std::__cxx11::string::~string((string *)&c);
  std::__cxx11::string::string((string *)&epath,"/",(allocator *)&gpath);
  std::__cxx11::string::string((string *)&fpath,"",(allocator *)&local_528);
  tinyusdz::Path::Path(&c,&epath._prim_part,&fpath._prim_part);
  std::__cxx11::string::~string((string *)&fpath);
  std::__cxx11::string::~string((string *)&epath);
  std::__cxx11::string::string((string *)&fpath,"/dora",(allocator *)&local_528);
  std::__cxx11::string::string((string *)&gpath,"",(allocator *)&local_368);
  tinyusdz::Path::Path(&epath,&fpath._prim_part,&gpath._prim_part);
  std::__cxx11::string::~string((string *)&gpath);
  std::__cxx11::string::~string((string *)&fpath);
  std::__cxx11::string::string((string *)&gpath,"/dora",(allocator *)&local_368);
  std::__cxx11::string::string((string *)&local_528,"bora",&local_6ca);
  tinyusdz::Path::Path(&fpath,&gpath._prim_part,&local_528);
  std::__cxx11::string::~string((string *)&local_528);
  std::__cxx11::string::~string((string *)&gpath);
  std::__cxx11::string::string((string *)&local_528,"/dora2",&local_6ca);
  std::__cxx11::string::string((string *)&local_368,"bora",&local_6c9);
  tinyusdz::Path::Path(&gpath,&local_528,&local_368);
  std::__cxx11::string::~string((string *)&local_368);
  std::__cxx11::string::~string((string *)&local_528);
  bVar1 = tinyusdz::Path::has_prefix(&path,&c);
  acutest_check_((uint)bVar1,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/tests/unit/unit-prim-types.cc"
                 ,0x6c,"%s","apath.has_prefix(dpath) == true");
  bVar1 = tinyusdz::Path::has_prefix(&path,&epath);
  acutest_check_((uint)bVar1,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/tests/unit/unit-prim-types.cc"
                 ,0x6d,"%s","apath.has_prefix(epath) == true");
  bVar1 = tinyusdz::Path::has_prefix(&path_1,&path);
  acutest_check_((uint)!bVar1,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/tests/unit/unit-prim-types.cc"
                 ,0x6e,"%s","bpath.has_prefix(apath) == false");
  bVar1 = tinyusdz::Path::has_prefix(&path,&cpath);
  acutest_check_((uint)!bVar1,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/tests/unit/unit-prim-types.cc"
                 ,0x6f,"%s","apath.has_prefix(cpath) == false");
  bVar1 = tinyusdz::Path::has_prefix(&fpath,&c);
  acutest_check_((uint)bVar1,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/tests/unit/unit-prim-types.cc"
                 ,0x70,"%s","fpath.has_prefix(dpath) == true");
  bVar1 = tinyusdz::Path::has_prefix(&fpath,&fpath);
  acutest_check_((uint)bVar1,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/tests/unit/unit-prim-types.cc"
                 ,0x71,"%s","fpath.has_prefix(fpath) == true");
  bVar1 = tinyusdz::Path::has_prefix(&gpath,&fpath);
  acutest_check_((uint)!bVar1,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/tests/unit/unit-prim-types.cc"
                 ,0x72,"%s","gpath.has_prefix(fpath) == false");
  tinyusdz::Path::~Path(&gpath);
  tinyusdz::Path::~Path(&fpath);
  tinyusdz::Path::~Path(&epath);
  tinyusdz::Path::~Path(&c);
  tinyusdz::Path::~Path(&cpath);
  tinyusdz::Path::~Path(&path_1);
  tinyusdz::Path::~Path(&path);
  return;
}

Assistant:

void prim_type_test(void) {
  // Path
  {
    Path path("/", "");
    TEST_CHECK(path.is_root_path() == true);
    TEST_CHECK(path.is_root_prim() == false);
    // invalid 
    TEST_CHECK(path.get_parent_path().is_valid() == false);
  }

  {
    Path path("/bora", "");
    auto ret = path.split_at_root();
    TEST_CHECK(std::get<0>(ret).full_path_name() == "/bora");
    TEST_CHECK(std::get<1>(ret).is_empty() == true);
    TEST_CHECK(path.get_parent_path().full_path_name() == "/");
    TEST_CHECK(path.get_parent_prim_path().full_path_name() == "/bora");
  }

  {
    Path path("/dora/bora", "");
    TEST_CHECK(path.element_name() == "bora"); // leaf name
    auto ret = path.split_at_root();
    TEST_CHECK(std::get<0>(ret).is_valid() == true);
    TEST_CHECK(std::get<0>(ret).full_path_name() == "/dora");
    TEST_CHECK(std::get<1>(ret).is_valid() == true);
    TEST_CHECK(std::get<1>(ret).full_path_name() == "/bora");
  }

  {
    Path path("dora", "");
    auto ret = path.split_at_root();
    TEST_CHECK(std::get<0>(ret).is_empty() == true);
    TEST_CHECK(std::get<1>(ret).is_valid() == true);
    TEST_CHECK(std::get<1>(ret).full_path_name() == "dora");
    TEST_CHECK(path.get_parent_path().is_valid() == false);
  }

  {
    Path rpath("dora", "");
    TEST_CHECK(rpath.make_relative().full_path_name() == "dora");

    Path apath("/dora", "");
    TEST_CHECK(apath.make_relative().full_path_name() == "dora");

    Path cpath("/dora", "");
    Path c;
    TEST_CHECK(c.make_relative(cpath).full_path_name() == "dora"); // std::move
  }

  {
    Path rpath("/dora", "bora");
    TEST_CHECK(rpath.full_path_name() == "/dora.bora");

    // Currently Allow prop path in prim
    // TODO: Disallow prop path in prim
    Path apath("/dora.bora", "");
    TEST_CHECK(apath.full_path_name() == "/dora.bora");
    TEST_CHECK(apath.element_name() == "bora");
  }

  {
    Path apath("/dora", "bora");
    TEST_CHECK(apath.full_path_name() == "/dora.bora");
    TEST_CHECK(apath.element_name() == "bora");
    std::cout << "parent_path = " << apath.get_parent_path().full_path_name() << "\n";
    std::cout << "parent_path = " << apath.get_parent_prim_path().full_path_name() << "\n";

    TEST_CHECK(apath.get_parent_path().full_path_name() == "/dora");
  }

  {
    Path apath("/dora/bora", "");
    Path bpath("/dora", "");
    Path cpath("/doraa", "");
    Path dpath = bpath.AppendProperty("hello");
    Path epath = bpath.AppendProperty("hell");

    std::cout << "epath = " << epath.full_path_name() << "\n";

    TEST_CHECK(bpath < apath);
    TEST_CHECK(bpath < cpath);
    TEST_CHECK(bpath < dpath);
    TEST_CHECK(epath < dpath);
  }

  {
    Path apath("/dora/bora", "");
    Path bpath("/dora/bora2", "");
    Path cpath("/doraa", "");
    Path dpath("/", "");
    Path epath("/dora", "");
    Path fpath("/dora", "bora");
    Path gpath("/dora2", "bora");

    TEST_CHECK(apath.has_prefix(dpath) == true);
    TEST_CHECK(apath.has_prefix(epath) == true);
    TEST_CHECK(bpath.has_prefix(apath) == false);
    TEST_CHECK(apath.has_prefix(cpath) == false);
    TEST_CHECK(fpath.has_prefix(dpath) == true);
    TEST_CHECK(fpath.has_prefix(fpath) == true);
    TEST_CHECK(gpath.has_prefix(fpath) == false);
  }

}